

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QLocaleId __thiscall QLocaleId::withLikelySubtagsAdded(QLocaleId *this)

{
  long lVar1;
  QLocaleId QVar2;
  size_t sVar3;
  LikelyPair *pLVar4;
  LikelyPair *pLVar5;
  long lVar6;
  LikelyPair *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  QLocaleId *key_1;
  QLocaleId *key;
  LikelyPair *afterPairs;
  LikelyPair *pairs;
  LikelyPair sought;
  QLocaleId value;
  LikelyPair *in_stack_ffffffffffffffa8;
  LikelyPair *in_stack_ffffffffffffffb0;
  LikelyPair *local_40;
  undefined4 local_e;
  ushort local_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::size<QLocaleId,1578ul>(&likely_subtags);
  lVar6 = (sVar3 >> 1) * 0xc;
  pLVar5 = (LikelyPair *)(likely_subtags + (sVar3 >> 1) * 2);
  if ((in_RDI->key).language_id == 0) {
LAB_00149f2d:
    if ((in_RDI->key).territory_id == 0) {
LAB_0014a080:
      if ((((in_RDI->key).script_id == 0) ||
          (pLVar4 = std::
                    lower_bound<(anonymous_namespace)::LikelyPair_const*,(anonymous_namespace)::LikelyPair>
                              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI),
          pLVar5 <= pLVar4)) || ((pLVar4->key).script_id != (in_RDI->key).script_id)) {
        bVar7 = matchesAll((QLocaleId *)(&UNK_00196114 + lVar6));
        if (bVar7) {
          local_e = *(undefined4 *)(&DAT_0019611a + lVar6);
          local_a = *(ushort *)(&DAT_0019611e + lVar6);
          if ((in_RDI->key).language_id != 0) {
            local_e._2_2_ = (undefined2)((uint)local_e >> 0x10);
            local_e = CONCAT22(local_e._2_2_,(in_RDI->key).language_id);
          }
          if ((in_RDI->key).territory_id != 0) {
            local_a = (in_RDI->key).territory_id;
          }
          if ((in_RDI->key).script_id != 0) {
            local_e = CONCAT22((in_RDI->key).script_id,(undefined2)local_e);
          }
        }
        else {
          local_e._0_2_ = (in_RDI->key).language_id;
          local_e._2_2_ = (in_RDI->key).script_id;
          local_a = (in_RDI->key).territory_id;
        }
      }
      else {
        local_e._0_2_ = (pLVar4->value).language_id;
        local_e._2_2_ = (pLVar4->value).script_id;
        local_a = (pLVar4->value).territory_id;
        if ((in_RDI->key).language_id != 0) {
          local_e = CONCAT22(local_e._2_2_,(in_RDI->key).language_id);
        }
        if ((in_RDI->key).territory_id != 0) {
          local_a = (in_RDI->key).territory_id;
        }
      }
    }
    else {
      local_40 = std::
                 lower_bound<(anonymous_namespace)::LikelyPair_const*,(anonymous_namespace)::LikelyPair>
                           (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI);
      while( true ) {
        bVar7 = false;
        if (local_40 < pLVar5) {
          bVar7 = (local_40->key).territory_id == (in_RDI->key).territory_id;
        }
        if (!bVar7) goto LAB_0014a080;
        if (((local_40->key).script_id == 0) ||
           ((local_40->key).script_id == (in_RDI->key).script_id)) break;
        in_stack_ffffffffffffffa8 = local_40;
        local_40 = local_40 + 1;
      }
      local_e._0_2_ = (local_40->value).language_id;
      local_e._2_2_ = (local_40->value).script_id;
      local_a = (local_40->value).territory_id;
      if ((in_RDI->key).language_id != 0) {
        local_e = CONCAT22(local_e._2_2_,(in_RDI->key).language_id);
      }
      if (((in_RDI->key).script_id != 0) && ((local_40->key).script_id == 0)) {
        local_e = CONCAT22((in_RDI->key).script_id,(undefined2)local_e);
      }
    }
  }
  else {
    local_40 = std::
               lower_bound<(anonymous_namespace)::LikelyPair_const*,(anonymous_namespace)::LikelyPair>
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI);
    while( true ) {
      bVar7 = false;
      if (local_40 < pLVar5) {
        bVar7 = (local_40->key).language_id == (in_RDI->key).language_id;
      }
      if (!bVar7) goto LAB_00149f2d;
      if ((((local_40->key).territory_id == 0) ||
          ((local_40->key).territory_id == (in_RDI->key).territory_id)) &&
         (((local_40->key).script_id == 0 || ((local_40->key).script_id == (in_RDI->key).script_id))
         )) break;
      in_stack_ffffffffffffffb0 = local_40;
      local_40 = local_40 + 1;
    }
    local_e._0_2_ = (local_40->value).language_id;
    local_e._2_2_ = (local_40->value).script_id;
    local_a = (local_40->value).territory_id;
    if (((in_RDI->key).territory_id != 0) && ((local_40->key).territory_id == 0)) {
      local_a = (in_RDI->key).territory_id;
    }
    if (((in_RDI->key).script_id != 0) && ((local_40->key).script_id == 0)) {
      local_e = CONCAT22((in_RDI->key).script_id,(undefined2)local_e);
    }
  }
  QVar2.territory_id = local_a;
  QVar2.language_id = (undefined2)local_e;
  QVar2.script_id = local_e._2_2_;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar2;
}

Assistant:

QLocaleId QLocaleId::withLikelySubtagsAdded() const noexcept
{
    /* Each pattern that appears in a comments below, language_script_region and
       similar, indicates which of this's fields (even if blank) are being
       attended to in a given search; for fields left out of the pattern, the
       search uses 0 regardless of whether this has specified the field.

       If a key matches what we're searching for (possibly with a wildcard in
       the key matching a non-wildcard in our search), the tags from this that
       are specified in the key are replaced by the match (even if different);
       but the other tags of this replace what's in the match (even when the
       match does specify a value).

       Keep QLocaleXmlReader.__fillLikely() in sync with this, to ensure
       locale-appropriate time-zone naming works correctly.
    */
    static_assert(std::size(likely_subtags) % 2 == 0);
    auto *pairs = reinterpret_cast<const LikelyPair *>(likely_subtags);
    auto *const afterPairs = pairs + std::size(likely_subtags) / 2;
    LikelyPair sought { *this };
    // Our array is sorted in the order that puts all candidate matches in the
    // order we would want them; ones we should prefer appear before the others.
    if (language_id) {
        // language_script_region, language_region, language_script, language:
        pairs = std::lower_bound(pairs, afterPairs, sought);
        // Single language's block isn't long enough to warrant more binary
        // chopping within it - just traverse it all:
        for (; pairs < afterPairs && pairs->key.language_id == language_id; ++pairs) {
            const QLocaleId &key = pairs->key;
            if (key.territory_id && key.territory_id != territory_id)
                continue;
            if (key.script_id && key.script_id != script_id)
                continue;
            QLocaleId value = pairs->value;
            if (territory_id && !key.territory_id)
                value.territory_id = territory_id;
            if (script_id && !key.script_id)
                value.script_id = script_id;
            return value;
        }
    }
    // und_script_region or und_region (in that order):
    if (territory_id) {
        sought.key = QLocaleId { 0, script_id, territory_id };
        pairs = std::lower_bound(pairs, afterPairs, sought);
        // Again, individual und_?_region block isn't long enough to make binary
        // chop a win:
        for (; pairs < afterPairs && pairs->key.territory_id == territory_id; ++pairs) {
            const QLocaleId &key = pairs->key;
            Q_ASSERT(!key.language_id);
            if (key.script_id && key.script_id != script_id)
                continue;
            QLocaleId value = pairs->value;
            if (language_id)
                value.language_id = language_id;
            if (script_id && !key.script_id)
                value.script_id = script_id;
            return value;
        }
    }
    // und_script:
    if (script_id) {
        sought.key = QLocaleId { 0, script_id, 0 };
        pairs = std::lower_bound(pairs, afterPairs, sought);
        if (pairs < afterPairs && pairs->key.script_id == script_id) {
            Q_ASSERT(!pairs->key.language_id && !pairs->key.territory_id);
            QLocaleId value = pairs->value;
            if (language_id)
                value.language_id = language_id;
            if (territory_id)
                value.territory_id = territory_id;
            return value;
        }
    }
    // Finally, fall back to the match-all rule (if there is one):
    pairs = afterPairs - 1; // All other keys are < match-all.
    if (pairs->key.matchesAll()) {
        QLocaleId value = pairs->value;
        if (language_id)
            value.language_id = language_id;
        if (territory_id)
            value.territory_id = territory_id;
        if (script_id)
            value.script_id = script_id;
        return value;
    }
    return *this;
}